

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenOffsetType_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,StructDef *struct_def)

{
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  StructDef *local_20;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  local_20 = struct_def;
  struct_def_local = (StructDef *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  NamespacedName_abi_cxx11_(&local_60,this,&struct_def->super_Definition);
  std::operator+(&local_40,"Offset<",&local_60);
  std::operator+(__return_storage_ptr__,&local_40,">");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string GenOffsetType(const StructDef &struct_def) const {
    return "Offset<" + NamespacedName(struct_def) + ">";
  }